

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_socket_init(cio_socket *socket,cio_address_family address_family,cio_eventloop *loop,
                         uint64_t close_timeout_ns,cio_socket_close_hook_t close_hook)

{
  int client_fd;
  int *piVar1;
  cio_error err;
  int socket_fd;
  cio_socket_close_hook_t close_hook_local;
  uint64_t close_timeout_ns_local;
  cio_eventloop *loop_local;
  cio_address_family address_family_local;
  cio_socket *socket_local;
  
  if ((socket == (cio_socket *)0x0) || (loop == (cio_eventloop *)0x0)) {
    socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    client_fd = cio_linux_socket_create(address_family);
    if (client_fd == -1) {
      piVar1 = __errno_location();
      socket_local._4_4_ = -*piVar1;
    }
    else {
      socket_local._4_4_ = cio_linux_socket_init(socket,client_fd,loop,close_timeout_ns,close_hook);
      if (socket_local._4_4_ != CIO_SUCCESS) {
        close(client_fd);
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_socket_init(struct cio_socket *socket,
                               enum cio_address_family address_family,
                               struct cio_eventloop *loop,
                               uint64_t close_timeout_ns,
                               cio_socket_close_hook_t close_hook)
{
	if (cio_unlikely(socket == NULL) || (loop == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	int socket_fd = cio_linux_socket_create(address_family);
	if (cio_unlikely(socket_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	enum cio_error err = cio_linux_socket_init(socket, socket_fd, loop, close_timeout_ns, close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		close(socket_fd);
	}

	return err;
}